

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_add_fitness(REF_HISTOGRAM ref_histogram,REF_GRID ref_grid)

{
  REF_CELL ref_cell;
  REF_STATUS RVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  int cell;
  REF_DBL fitness;
  REF_INT nodes [27];
  
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    pcVar4 = "twod only";
    uVar2 = 6;
    uVar3 = 0x1d4;
  }
  else {
    ref_cell = ref_grid->cell[3];
    for (cell = 0; cell < ref_cell->max; cell = cell + 1) {
      RVar1 = ref_cell_nodes(ref_cell,cell,nodes);
      if ((RVar1 == 0) && (ref_grid->node->part[nodes[0]] == ref_grid->mpi->id)) {
        if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
          fitness = 1.0;
        }
        else {
          uVar2 = ref_node_tri_fitness(ref_grid->node,nodes,&fitness);
          if (uVar2 != 0) {
            pcVar4 = "qual";
            uVar3 = 0x1db;
            goto LAB_00164fb3;
          }
          if (fitness <= 0.0) goto LAB_00164f05;
        }
        uVar2 = ref_histogram_add(ref_histogram,fitness);
        if (uVar2 != 0) {
          pcVar4 = "add";
          uVar3 = 0x1df;
          goto LAB_00164fb3;
        }
      }
LAB_00164f05:
    }
    uVar2 = ref_histogram_gather(ref_histogram,ref_grid->mpi);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar4 = "gather";
    uVar3 = 0x1e3;
  }
LAB_00164fb3:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",uVar3
         ,"ref_histogram_add_fitness",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add_fitness(REF_HISTOGRAM ref_histogram,
                                             REF_GRID ref_grid) {
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL fitness;

  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
    RSS(REF_IMPLEMENT, "twod only");
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_node_part(ref_grid_node(ref_grid), nodes[0]) ==
        ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
        RSS(ref_node_tri_fitness(ref_grid_node(ref_grid), nodes, &fitness),
            "qual");
      } else {
        fitness = 1.0;
      }
      if (fitness > 0.0) RSS(ref_histogram_add(ref_histogram, fitness), "add");
    }
  }

  RSS(ref_histogram_gather(ref_histogram, ref_grid_mpi(ref_grid)), "gather");

  return REF_SUCCESS;
}